

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

void SUNMatDestroy_Sparse(SUNMatrix A)

{
  SUNMatrix A_local;
  
  if (*(long *)((long)A->content + 0x20) != 0) {
    free(*(void **)((long)A->content + 0x20));
    *(undefined8 *)((long)A->content + 0x20) = 0;
  }
  if (*(long *)((long)A->content + 0x30) != 0) {
    free(*(void **)((long)A->content + 0x30));
    *(undefined8 *)((long)A->content + 0x30) = 0;
    *(undefined8 *)((long)A->content + 0x40) = 0;
    *(undefined8 *)((long)A->content + 0x50) = 0;
  }
  if (*(long *)((long)A->content + 0x38) != 0) {
    free(*(void **)((long)A->content + 0x38));
    *(undefined8 *)((long)A->content + 0x38) = 0;
    *(undefined8 *)((long)A->content + 0x48) = 0;
    *(undefined8 *)((long)A->content + 0x58) = 0;
  }
  free(A->content);
  A->content = (void *)0x0;
  free(A->ops);
  A->ops = (_generic_SUNMatrix_Ops *)0x0;
  free(A);
  return;
}

Assistant:

void SUNMatDestroy_Sparse(SUNMatrix A)
{
  /* perform operation */
  if (SM_DATA_S(A)) {
    free(SM_DATA_S(A));  SM_DATA_S(A) = NULL;
  }
  if (SM_INDEXVALS_S(A)) {
    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = NULL;
    SM_CONTENT_S(A)->rowvals = NULL;
    SM_CONTENT_S(A)->colvals = NULL;
  }
  if (SM_INDEXPTRS_S(A)) {
    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = NULL;
    SM_CONTENT_S(A)->colptrs = NULL;
    SM_CONTENT_S(A)->rowptrs = NULL;
  }
  free(A->content); A->content = NULL;
  free(A->ops);  A->ops = NULL;
  free(A); A = NULL;
  return;
}